

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STACK.h
# Opt level: O0

bool __thiscall STACK<int>::pop(STACK<int> *this)

{
  NODE<int>_conflict *pNVar1;
  NODE<int>_conflict *p_1;
  NODE<int>_conflict *p;
  int x;
  STACK<int> *this_local;
  
  if (this->m_pHead == (NODE<int>_conflict *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->m_pHead == this->m_pTail) {
    pNVar1 = this->m_pHead;
    this->m_pTail = (NODE<int>_conflict *)0x0;
    this->m_pHead = (NODE<int>_conflict *)0x0;
    if (pNVar1 != (NODE<int>_conflict *)0x0) {
      operator_delete(pNVar1);
    }
    this_local._7_1_ = true;
  }
  else {
    pNVar1 = this->m_pHead;
    this->m_pHead = this->m_pHead->pNext;
    if (pNVar1 != (NODE<int>_conflict *)0x0) {
      operator_delete(pNVar1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool STACK<T>::pop()
{
	T x;
	if (m_pHead == NULL)
	{
		return false;
	}
	if (m_pHead == m_pTail) {
		NODE<T> *p = m_pHead;
		m_pHead = m_pTail = NULL;
		delete p;
		return true;
	}
	else {
		NODE<T> *p = m_pHead;
		m_pHead = m_pHead->pNext;
		delete p;
		return true;
	}
}